

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void idct16_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i _in1_5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  __m128i _in0;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i _in0_6;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i _in0_5;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i _in1_2;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i _in0_3;
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  __m128i _in1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  __m128i _in0_4;
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  __m128i _in0_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i _in0_2;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i _in1_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  __m128i alVar98;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  
  alVar98 = input[1];
  alVar1 = input[2];
  alVar2 = input[9];
  auVar76._0_12_ = alVar98._0_12_;
  auVar76._12_2_ = alVar98[0]._6_2_;
  auVar76._14_2_ = *(undefined2 *)((long)input[0xf] + 6);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._0_10_ = alVar98._0_10_;
  auVar75._10_2_ = *(undefined2 *)((long)input[0xf] + 4);
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._0_8_ = alVar98[0];
  auVar74._8_2_ = alVar98[0]._4_2_;
  auVar73._8_8_ = auVar74._8_8_;
  auVar73._6_2_ = *(undefined2 *)((long)input[0xf] + 2);
  auVar73._4_2_ = alVar98[0]._2_2_;
  auVar73._0_2_ = (undefined2)alVar98[0];
  auVar73._2_2_ = (short)input[0xf][0];
  auVar42._8_4_ = 0xf0140191;
  auVar42._0_8_ = 0xf0140191f0140191;
  auVar42._12_4_ = 0xf0140191;
  auVar43 = pmaddwd(auVar42,auVar73);
  auVar64._8_4_ = 0x1910fec;
  auVar64._0_8_ = 0x1910fec01910fec;
  auVar64._12_4_ = 0x1910fec;
  auVar65 = pmaddwd(auVar64,auVar73);
  auVar62._0_12_ = alVar2._0_12_;
  auVar62._12_2_ = alVar2[0]._6_2_;
  auVar62._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar29._12_4_ = auVar62._12_4_;
  auVar29._0_10_ = alVar2._0_10_;
  auVar29._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar78._10_6_ = auVar29._10_6_;
  auVar78._0_8_ = alVar2[0];
  auVar78._8_2_ = alVar2[0]._4_2_;
  auVar45._8_8_ = auVar78._8_8_;
  auVar45._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar45._4_2_ = alVar2[0]._2_2_;
  auVar45._0_2_ = (undefined2)alVar2[0];
  auVar45._2_2_ = (short)input[7][0];
  alVar98 = input[4];
  auVar77._8_4_ = 0xf5da0c5e;
  auVar77._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar77._12_4_ = 0xf5da0c5e;
  auVar78 = pmaddwd(auVar77,auVar45);
  auVar38._8_4_ = 0xc5e0a26;
  auVar38._0_8_ = 0xc5e0a260c5e0a26;
  auVar38._12_4_ = 0xc5e0a26;
  auVar39 = pmaddwd(auVar38,auVar45);
  alVar2 = input[5];
  auVar84._0_12_ = alVar2._0_12_;
  auVar84._12_2_ = alVar2[0]._6_2_;
  auVar84._14_2_ = *(undefined2 *)((long)input[0xb] + 6);
  auVar80._12_4_ = auVar84._12_4_;
  auVar80._0_10_ = alVar2._0_10_;
  auVar80._10_2_ = *(undefined2 *)((long)input[0xb] + 4);
  auVar95._10_6_ = auVar80._10_6_;
  auVar95._0_8_ = alVar2[0];
  auVar95._8_2_ = alVar2[0]._4_2_;
  auVar53._8_8_ = auVar95._8_8_;
  auVar53._6_2_ = *(undefined2 *)((long)input[0xb] + 2);
  auVar53._4_2_ = alVar2[0]._2_2_;
  auVar53._0_2_ = (undefined2)alVar2[0];
  auVar53._2_2_ = (short)input[0xb][0];
  auVar61._8_4_ = 0xf1e4078b;
  auVar61._0_8_ = 0xf1e4078bf1e4078b;
  auVar61._12_4_ = 0xf1e4078b;
  auVar62 = pmaddwd(auVar61,auVar53);
  auVar94._8_4_ = 0x78b0e1c;
  auVar94._0_8_ = 0x78b0e1c078b0e1c;
  auVar94._12_4_ = 0x78b0e1c;
  auVar95 = pmaddwd(auVar94,auVar53);
  alVar2 = input[0xd];
  auVar60._0_12_ = alVar2._0_12_;
  auVar60._12_2_ = alVar2[0]._6_2_;
  auVar60._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar55._12_4_ = auVar60._12_4_;
  auVar55._0_10_ = alVar2._0_10_;
  auVar55._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar89._10_6_ = auVar55._10_6_;
  auVar89._0_8_ = alVar2[0];
  auVar89._8_2_ = alVar2[0]._4_2_;
  auVar97._8_8_ = auVar89._8_8_;
  auVar97._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar97._4_2_ = alVar2[0]._2_2_;
  auVar97._0_2_ = (undefined2)alVar2[0];
  auVar97._2_2_ = (short)input[3][0];
  auVar25._8_4_ = 0xfb5b0f50;
  auVar25._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar25._12_4_ = 0xfb5b0f50;
  auVar26 = pmaddwd(auVar25,auVar97);
  auVar83._8_4_ = 0xf5004a5;
  auVar83._0_8_ = 0xf5004a50f5004a5;
  auVar83._12_4_ = 0xf5004a5;
  auVar84 = pmaddwd(auVar83,auVar97);
  alVar2 = input[10];
  auVar19._0_12_ = alVar1._0_12_;
  auVar19._12_2_ = alVar1[0]._6_2_;
  auVar19._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = alVar1._0_10_;
  auVar18._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = alVar1[0];
  auVar17._8_2_ = alVar1[0]._4_2_;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar16._4_2_ = alVar1[0]._2_2_;
  auVar16._0_2_ = (undefined2)alVar1[0];
  auVar16._2_2_ = (short)input[0xe][0];
  auVar8._0_12_ = alVar2._0_12_;
  auVar8._12_2_ = alVar2[0]._6_2_;
  auVar8._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._0_10_ = alVar2._0_10_;
  auVar7._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar6._10_6_ = auVar7._10_6_;
  auVar6._0_8_ = alVar2[0];
  auVar6._8_2_ = alVar2[0]._4_2_;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar5._4_2_ = alVar2[0]._2_2_;
  auVar5._0_2_ = (undefined2)alVar2[0];
  auVar5._2_2_ = (short)input[6][0];
  auVar59._0_12_ = alVar98._0_12_;
  auVar59._12_2_ = alVar98[0]._6_2_;
  auVar59._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._0_10_ = alVar98._0_10_;
  auVar58._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._0_8_ = alVar98[0];
  auVar57._8_2_ = alVar98[0]._4_2_;
  auVar56._8_8_ = auVar57._8_8_;
  auVar56._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar56._4_2_ = alVar98[0]._2_2_;
  auVar56._0_2_ = (undefined2)alVar98[0];
  auVar56._2_2_ = (short)input[0xc][0];
  auVar28._8_4_ = 0xf04f031f;
  auVar28._0_8_ = 0xf04f031ff04f031f;
  auVar28._12_4_ = 0xf04f031f;
  auVar29 = pmaddwd(auVar28,auVar16);
  auVar88._8_4_ = 0x31f0fb1;
  auVar88._0_8_ = 0x31f0fb1031f0fb1;
  auVar88._12_4_ = 0x31f0fb1;
  auVar89 = pmaddwd(auVar88,auVar16);
  auVar44._0_4_ = auVar43._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar43._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar43._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar43._12_4_ + 0x800 >> 0xc;
  auVar45 = packssdw(auVar44,auVar44);
  auVar79._0_4_ = auVar78._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar78._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar78._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar78._12_4_ + 0x800 >> 0xc;
  auVar80 = packssdw(auVar79,auVar79);
  auVar63._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar96._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar95 = packssdw(auVar63,auVar63);
  auVar97 = packssdw(auVar96,auVar96);
  auVar27._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar85._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar62 = packssdw(auVar27,auVar27);
  auVar84 = packssdw(auVar85,auVar85);
  auVar43._8_4_ = 0xf71c0d4e;
  auVar43._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar43._12_4_ = 0xf71c0d4e;
  auVar26 = pmaddwd(auVar43,auVar5);
  auVar52._8_4_ = 0xd4e08e4;
  auVar52._0_8_ = 0xd4e08e40d4e08e4;
  auVar52._12_4_ = 0xd4e08e4;
  auVar53 = pmaddwd(auVar52,auVar5);
  auVar78 = paddsw(auVar45,auVar80);
  auVar80 = psubsw(auVar45,auVar80);
  auVar45 = psubsw(auVar62,auVar95);
  auVar95 = paddsw(auVar62,auVar95);
  auVar43 = paddsw(auVar84,auVar97);
  auVar97 = psubsw(auVar84,auVar97);
  auVar66._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar84 = packssdw(auVar66,auVar66);
  auVar40._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar62 = packssdw(auVar40,auVar40);
  auVar23._0_12_ = auVar45._0_12_;
  auVar23._12_2_ = auVar45._6_2_;
  auVar23._14_2_ = auVar97._6_2_;
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = auVar45._0_10_;
  auVar22._10_2_ = auVar97._4_2_;
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = auVar45._0_8_;
  auVar21._8_2_ = auVar45._4_2_;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._6_2_ = auVar97._2_2_;
  auVar20._4_2_ = auVar45._2_2_;
  auVar20._0_2_ = auVar45._0_2_;
  auVar20._2_2_ = auVar97._0_2_;
  auVar45 = psubsw(auVar84,auVar62);
  auVar49._0_12_ = auVar80._0_12_;
  auVar49._12_2_ = auVar80._6_2_;
  auVar49._14_2_ = auVar45._6_2_;
  auVar48._12_4_ = auVar49._12_4_;
  auVar48._0_10_ = auVar80._0_10_;
  auVar48._10_2_ = auVar45._4_2_;
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._0_8_ = auVar80._0_8_;
  auVar47._8_2_ = auVar80._4_2_;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._6_2_ = auVar45._2_2_;
  auVar46._4_2_ = auVar80._2_2_;
  auVar46._0_2_ = auVar80._0_2_;
  auVar46._2_2_ = auVar45._0_2_;
  auVar84 = paddsw(auVar62,auVar84);
  auVar30._0_4_ = auVar29._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar29._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar29._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar29._12_4_ + 0x800 >> 0xc;
  auVar90._0_4_ = auVar89._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar89._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar89._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar89._12_4_ + 0x800 >> 0xc;
  auVar45 = packssdw(auVar30,auVar30);
  auVar80 = packssdw(auVar90,auVar90);
  auVar39._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar39._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar39._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar39._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar54._0_4_ = auVar53._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar53._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar53._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar53._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar39,auVar39);
  auVar29 = packssdw(auVar54,auVar54);
  auVar9._8_4_ = 0xf138061f;
  auVar9._0_8_ = 0xf138061ff138061f;
  auVar9._12_4_ = 0xf138061f;
  auVar62 = pmaddwd(auVar9,auVar56);
  auVar81._8_4_ = 0x61f0ec8;
  auVar81._0_8_ = 0x61f0ec8061f0ec8;
  auVar81._12_4_ = 0x61f0ec8;
  auVar97 = pmaddwd(auVar81,auVar56);
  auVar53 = paddsw(auVar45,auVar26);
  auVar45 = psubsw(auVar45,auVar26);
  auVar26 = psubsw(auVar80,auVar29);
  auVar34._0_12_ = auVar45._0_12_;
  auVar34._12_2_ = auVar45._6_2_;
  auVar34._14_2_ = auVar26._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = auVar45._0_10_;
  auVar33._10_2_ = auVar26._4_2_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = auVar45._0_8_;
  auVar32._8_2_ = auVar45._4_2_;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = auVar26._2_2_;
  auVar31._4_2_ = auVar45._2_2_;
  auVar31._0_2_ = auVar45._0_2_;
  auVar31._2_2_ = auVar26._0_2_;
  auVar55 = paddsw(auVar29,auVar80);
  auVar86._8_4_ = 0x61ff138;
  auVar86._0_8_ = 0x61ff138061ff138;
  auVar86._12_4_ = 0x61ff138;
  auVar91._8_4_ = 0xec8061f;
  auVar91._0_8_ = 0xec8061f0ec8061f;
  auVar91._12_4_ = 0xec8061f;
  auVar92 = pmaddwd(auVar91,auVar46);
  auVar39 = pmaddwd(auVar46,auVar86);
  auVar65._8_4_ = 0xf138f9e1;
  auVar65._0_8_ = 0xf138f9e1f138f9e1;
  auVar65._12_4_ = 0xf138f9e1;
  auVar45 = pmaddwd(auVar65,auVar20);
  auVar29 = pmaddwd(auVar20,auVar86);
  auVar87._8_4_ = 0xb500b50;
  auVar87._0_8_ = 0xb500b500b500b50;
  auVar87._12_4_ = 0xb500b50;
  auVar50._8_4_ = 0xf4b00b50;
  auVar50._0_8_ = 0xf4b00b50f4b00b50;
  auVar50._12_4_ = 0xf4b00b50;
  auVar26._2_2_ = (short)input[8][0];
  auVar26._0_2_ = (short)(*input)[0];
  auVar26._4_2_ = *(undefined2 *)((long)*input + 2);
  auVar26._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar26._8_2_ = *(undefined2 *)((long)*input + 4);
  auVar26._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar26._12_2_ = *(undefined2 *)((long)*input + 6);
  auVar26._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar80 = pmaddwd(auVar50,auVar26);
  auVar26 = pmaddwd(auVar26,auVar87);
  auVar41._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar41,auVar41);
  auVar82._0_4_ = auVar97._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar97._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar97._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar97._12_4_ + 0x800 >> 0xc;
  auVar97 = packssdw(auVar82,auVar82);
  auVar60 = paddsw(auVar26,auVar97);
  auVar97 = psubsw(auVar26,auVar97);
  auVar51._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar80 = packssdw(auVar51,auVar51);
  auVar10._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar10,auVar10);
  auVar65 = paddsw(auVar80,auVar26);
  auVar89 = psubsw(auVar80,auVar26);
  auVar62 = paddsw(auVar78,auVar95);
  auVar78 = psubsw(auVar78,auVar95);
  auVar67._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar95 = packssdw(auVar67,auVar67);
  auVar3._0_4_ = auVar45._0_4_ + 0x800 >> 0xc;
  auVar3._4_4_ = auVar45._4_4_ + 0x800 >> 0xc;
  auVar3._8_4_ = auVar45._8_4_ + 0x800 >> 0xc;
  auVar3._12_4_ = auVar45._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar3,auVar3);
  auVar80 = paddsw(auVar95,auVar26);
  auVar95 = psubsw(auVar95,auVar26);
  auVar26 = psubsw(auVar84,auVar43);
  auVar14._0_12_ = auVar78._0_12_;
  auVar14._12_2_ = auVar78._6_2_;
  auVar14._14_2_ = auVar26._6_2_;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = auVar78._0_10_;
  auVar13._10_2_ = auVar26._4_2_;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = auVar78._0_8_;
  auVar12._8_2_ = auVar78._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = auVar26._2_2_;
  auVar11._4_2_ = auVar78._2_2_;
  auVar11._0_2_ = auVar78._0_2_;
  auVar11._2_2_ = auVar26._0_2_;
  auVar45 = paddsw(auVar84,auVar43);
  auVar93._0_4_ = auVar92._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar92._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar92._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar92._12_4_ + 0x800 >> 0xc;
  auVar84 = packssdw(auVar93,auVar93);
  auVar24._0_4_ = auVar29._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar29._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar29._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar29._12_4_ + 0x800 >> 0xc;
  auVar78 = packssdw(auVar24,auVar24);
  auVar26 = psubsw(auVar84,auVar78);
  auVar71._0_12_ = auVar95._0_12_;
  auVar71._12_2_ = auVar95._6_2_;
  auVar71._14_2_ = auVar26._6_2_;
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._0_10_ = auVar95._0_10_;
  auVar70._10_2_ = auVar26._4_2_;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._0_8_ = auVar95._0_8_;
  auVar69._8_2_ = auVar95._4_2_;
  auVar68._8_8_ = auVar69._8_8_;
  auVar68._6_2_ = auVar26._2_2_;
  auVar68._4_2_ = auVar95._2_2_;
  auVar68._0_2_ = auVar95._0_2_;
  auVar68._2_2_ = auVar26._0_2_;
  auVar95 = paddsw(auVar78,auVar84);
  auVar43 = paddsw(auVar60,auVar55);
  auVar60 = psubsw(auVar60,auVar55);
  auVar26 = pmaddwd(auVar31,auVar87);
  auVar35._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar35,auVar35);
  auVar55 = paddsw(auVar65,auVar26);
  auVar39 = psubsw(auVar65,auVar26);
  auVar36._8_4_ = 0xb50f4b0;
  auVar36._0_8_ = 0xb50f4b00b50f4b0;
  auVar36._12_4_ = 0xb50f4b0;
  auVar26 = pmaddwd(auVar31,auVar36);
  auVar92._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar92,auVar92);
  auVar78 = paddsw(auVar89,auVar26);
  auVar89 = psubsw(auVar89,auVar26);
  auVar65 = paddsw(auVar97,auVar53);
  auVar53 = psubsw(auVar97,auVar53);
  auVar26 = pmaddwd(auVar68,auVar36);
  auVar97 = pmaddwd(auVar68,auVar87);
  auVar84 = pmaddwd(auVar36,auVar11);
  auVar29 = pmaddwd(auVar11,auVar87);
  alVar98 = (__m128i)paddsw(auVar43,auVar45);
  *output = alVar98;
  alVar98 = (__m128i)psubsw(auVar43,auVar45);
  output[0xf] = alVar98;
  alVar98 = (__m128i)paddsw(auVar55,auVar95);
  output[1] = alVar98;
  alVar98 = (__m128i)psubsw(auVar55,auVar95);
  auVar72._0_4_ = auVar97._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar97._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar97._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar97._12_4_ + 0x800 >> 0xc;
  auVar45 = packssdw(auVar72,auVar72);
  output[0xe] = alVar98;
  alVar98 = (__m128i)paddsw(auVar78,auVar45);
  output[2] = alVar98;
  alVar98 = (__m128i)psubsw(auVar78,auVar45);
  auVar15._0_4_ = auVar29._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar29._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar29._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar29._12_4_ + 0x800 >> 0xc;
  auVar45 = packssdw(auVar15,auVar15);
  output[0xd] = alVar98;
  alVar98 = (__m128i)paddsw(auVar65,auVar45);
  output[3] = alVar98;
  alVar98 = (__m128i)psubsw(auVar65,auVar45);
  auVar37._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar45 = packssdw(auVar37,auVar37);
  output[0xc] = alVar98;
  alVar98 = (__m128i)paddsw(auVar53,auVar45);
  output[4] = alVar98;
  alVar98 = (__m128i)psubsw(auVar53,auVar45);
  auVar4._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar4._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar4._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar4._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar4,auVar4);
  output[0xb] = alVar98;
  alVar98 = (__m128i)paddsw(auVar89,auVar26);
  output[5] = alVar98;
  alVar98 = (__m128i)psubsw(auVar89,auVar26);
  output[10] = alVar98;
  alVar98 = (__m128i)paddsw(auVar39,auVar80);
  output[6] = alVar98;
  alVar98 = (__m128i)psubsw(auVar39,auVar80);
  output[9] = alVar98;
  alVar98 = (__m128i)paddsw(auVar60,auVar62);
  output[7] = alVar98;
  alVar98 = (__m128i)psubsw(auVar60,auVar62);
  output[8] = alVar98;
  return;
}

Assistant:

static void idct16_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[1] = input[8];
  x[2] = input[4];
  x[3] = input[12];
  x[4] = input[2];
  x[5] = input[10];
  x[6] = input[6];
  x[7] = input[14];
  x[8] = input[1];
  x[9] = input[9];
  x[10] = input[5];
  x[11] = input[13];
  x[12] = input[3];
  x[13] = input[11];
  x[14] = input[7];
  x[15] = input[15];

  // stage 2
  btf_16_4p_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_4p_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_4p_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_4p_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);

  // stage 3
  btf_16_4p_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_4p_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_4p_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_4p_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);

  // stage 6
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);

  // stage 7
  idct16_stage7_sse2(output, x);
}